

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::core::ConfidentialValue::ConfidentialValue(ConfidentialValue *this,ByteData *byte_data)

{
  size_t sVar1;
  const_reference pvVar2;
  CfdException *this_00;
  allocator local_111;
  string local_110;
  size_t local_f0;
  CfdSourceLocation local_e8;
  ByteData local_d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_78;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_70;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  ByteData *byte_data_local;
  ConfidentialValue *this_local;
  
  this->_vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_00891de8;
  ByteData::ByteData(&this->data_);
  this->version_ = '\0';
  sVar1 = ByteData::GetDataSize(byte_data);
  switch(sVar1) {
  case 0:
    break;
  default:
    local_e8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_e8.filename = local_e8.filename + 1;
    local_e8.line = 0x234;
    local_e8.funcname = "ConfidentialValue";
    local_f0 = ByteData::GetDataSize(byte_data);
    logger::warn<unsigned_long>(&local_e8,"Value size Invalid. size={}.",&local_f0);
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_110,"Value size Invalid.",&local_111);
    CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_110);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  case 8:
    this->version_ = '\x01';
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
    ByteData::GetBytes(&local_60,byte_data);
    local_48 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data,&this->version_);
    local_68._M_current =
         (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(local_48);
    local_70._M_current =
         (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(local_48);
    local_78 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               ::std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
    local_80 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               ::std::
               copy<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                         (local_68,local_70,
                          (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           )local_78);
    ByteData::ByteData((ByteData *)&data_1,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
    ByteData::operator=(&this->data_,(ByteData *)&data_1);
    ByteData::~ByteData((ByteData *)&data_1);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
    break;
  case 9:
  case 0x21:
    ByteData::GetBytes(&local_b8,byte_data);
    local_a0 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b8;
    pvVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_a0,0);
    this->version_ = *pvVar2;
    if (this->version_ == '\0') {
      ByteData::ByteData(&local_d0);
      ByteData::operator=(&this->data_,&local_d0);
      ByteData::~ByteData(&local_d0);
    }
    else {
      ByteData::operator=(&this->data_,byte_data);
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b8);
  }
  CheckVersion(this->version_);
  return;
}

Assistant:

ConfidentialValue::ConfidentialValue(const ByteData &byte_data)
    : data_(), version_(0) {
  switch (byte_data.GetDataSize()) {
    case 0:
      // do nothing
      break;
    case kAssetValueSize: {
      version_ = kConfidentialVersion_1;
      std::vector<uint8_t> bytes;
      const std::vector<uint8_t> &data = byte_data.GetBytes();
      bytes.push_back(version_);
      std::copy(data.begin(), data.end(), std::back_inserter(bytes));
      data_ = ByteData(bytes);
      break;
    }
    case kConfidentialDataSize:
    case kConfidentialValueSize: {
      const std::vector<uint8_t> &data = byte_data.GetBytes();
      version_ = data[0];
      if (version_ == 0) {
        data_ = ByteData();
      } else {
        data_ = byte_data;
      }
      break;
    }
    default:
      warn(
          CFD_LOG_SOURCE, "Value size Invalid. size={}.",
          byte_data.GetDataSize());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Value size Invalid.");
  }
  CheckVersion(version_);
}